

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

void * new__<Memory::ArenaAllocator>
                 (size_t byteSize,ArenaAllocator *alloc,bool nothrow,
                 offset_in_ArenaAllocator_to_subr AllocFunc)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  void *pvVar4;
  undefined7 in_register_00000011;
  long in_R8;
  long *plVar5;
  undefined8 *in_FS_OFFSET;
  
  if ((int)CONCAT71(in_register_00000011,nothrow) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x224,"(nothrow)","nothrow");
    if (!bVar3) goto LAB_00226fd6;
    *puVar1 = 0;
  }
  if (byteSize == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x225,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                       "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
    if (!bVar3) {
LAB_00226fd6:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  plVar5 = (long *)((long)&(alloc->
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>)
                           .super_Allocator.outOfMemoryFunc + in_R8);
  if ((AllocFunc & 1) != 0) {
    AllocFunc = *(undefined8 *)(*plVar5 + -1 + AllocFunc);
  }
  pvVar4 = (void *)(*(code *)AllocFunc)(plVar5,byteSize);
  return pvVar4;
}

Assistant:

__cdecl
operator new[](DECLSPEC_GUARD_OVERFLOW size_t byteSize, TAllocator * alloc, bool nothrow, char * (TAllocator::*AllocFunc)(size_t))
{
    Assert(nothrow);
    Assert(byteSize != 0 || !TAllocator::FakeZeroLengthArray);
    void * buffer = (alloc->*AllocFunc)(byteSize);
    return buffer;
}